

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 uVar19;
  byte bVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar24;
  byte bVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  size_t sVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 uVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar84;
  float fVar85;
  undefined1 auVar83 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  UVIdentity<4> mapUV;
  undefined1 local_26a8 [16];
  ulong local_2690;
  StackItemT<embree::NodeRefPtr<8>_> *local_2688;
  long local_2680;
  long local_2678;
  Scene *local_2670;
  RTCFilterFunctionNArguments args;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined1 local_2608 [32];
  undefined1 local_25e8 [32];
  undefined1 local_25c8 [32];
  undefined1 local_25a8 [32];
  undefined1 local_2588 [32];
  undefined1 local_2568 [32];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  UVIdentity<4> *local_2518;
  byte local_2510;
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  float local_24b8 [4];
  undefined1 local_24a8 [16];
  undefined8 local_2498;
  undefined8 uStack_2490;
  RTCHitN local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [16];
  undefined4 local_2448;
  undefined4 uStack_2444;
  undefined4 uStack_2440;
  undefined4 uStack_243c;
  undefined1 local_2438 [16];
  undefined1 local_2428 [16];
  uint local_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  uint uStack_2400;
  uint uStack_23fc;
  undefined1 local_23f8 [32];
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2688 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_2568 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar100 = ZEXT3264(local_2568);
  local_2588 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar101 = ZEXT3264(local_2588);
  local_25a8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar102 = ZEXT3264(local_25a8);
  fVar75 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_25c8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar75 * 0.99999964)));
  auVar103 = ZEXT3264(local_25c8);
  local_25e8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar82 * 0.99999964)));
  auVar104 = ZEXT3264(local_25e8);
  local_2608 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar90 * 0.99999964)));
  auVar105 = ZEXT3264(local_2608);
  fVar75 = fVar75 * 1.0000004;
  fVar82 = fVar82 * 1.0000004;
  fVar90 = fVar90 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar31 = uVar29 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_23f8._4_4_ = iVar2;
  local_23f8._0_4_ = iVar2;
  local_23f8._8_4_ = iVar2;
  local_23f8._12_4_ = iVar2;
  local_23f8._16_4_ = iVar2;
  local_23f8._20_4_ = iVar2;
  local_23f8._24_4_ = iVar2;
  local_23f8._28_4_ = iVar2;
  auVar97 = ZEXT3264(local_23f8);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar68 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_24a8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar98 = ZEXT3264(_DAT_01fe9900);
  auVar99 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  local_2398 = fVar75;
  fStack_2394 = fVar75;
  fStack_2390 = fVar75;
  fStack_238c = fVar75;
  fStack_2388 = fVar75;
  fStack_2384 = fVar75;
  fStack_2380 = fVar75;
  fStack_237c = fVar75;
  local_23b8 = fVar82;
  fStack_23b4 = fVar82;
  fStack_23b0 = fVar82;
  fStack_23ac = fVar82;
  fStack_23a8 = fVar82;
  fStack_23a4 = fVar82;
  fStack_23a0 = fVar82;
  fStack_239c = fVar82;
  local_23d8 = fVar90;
  fStack_23d4 = fVar90;
  fStack_23d0 = fVar90;
  fStack_23cc = fVar90;
  fStack_23c8 = fVar90;
  fStack_23c4 = fVar90;
  fStack_23c0 = fVar90;
  fStack_23bc = fVar90;
  fVar76 = fVar75;
  fVar77 = fVar75;
  fVar78 = fVar75;
  fVar79 = fVar75;
  fVar80 = fVar75;
  fVar81 = fVar75;
  fVar84 = fVar82;
  fVar85 = fVar82;
  fVar86 = fVar82;
  fVar87 = fVar82;
  fVar88 = fVar82;
  fVar89 = fVar82;
  fVar91 = fVar90;
  fVar92 = fVar90;
  fVar93 = fVar90;
  fVar94 = fVar90;
  fVar95 = fVar90;
  fVar96 = fVar90;
  local_2690 = uVar29;
  do {
    pSVar24 = local_2688 + -1;
    local_2688 = local_2688 + -1;
    if ((float)pSVar24->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar33 = (local_2688->ptr).ptr;
      while ((sVar33 & 8) == 0) {
        auVar59 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar29),auVar100._0_32_);
        auVar59 = vmulps_avx512vl(auVar103._0_32_,auVar59);
        auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar30),auVar101._0_32_);
        auVar60 = vmulps_avx512vl(auVar104._0_32_,auVar60);
        auVar59 = vmaxps_avx(auVar59,auVar60);
        auVar60 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar34),auVar102._0_32_);
        auVar60 = vmulps_avx512vl(auVar105._0_32_,auVar60);
        auVar60 = vmaxps_avx(auVar60,auVar97._0_32_);
        auVar59 = vmaxps_avx(auVar59,auVar60);
        auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + uVar31),auVar100._0_32_);
        auVar60._4_4_ = fVar76 * auVar61._4_4_;
        auVar60._0_4_ = fVar75 * auVar61._0_4_;
        auVar60._8_4_ = fVar77 * auVar61._8_4_;
        auVar60._12_4_ = fVar78 * auVar61._12_4_;
        auVar60._16_4_ = fVar79 * auVar61._16_4_;
        auVar60._20_4_ = fVar80 * auVar61._20_4_;
        auVar60._24_4_ = fVar81 * auVar61._24_4_;
        auVar60._28_4_ = auVar61._28_4_;
        auVar62 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + (uVar30 ^ 0x20)),
                                  auVar101._0_32_);
        auVar61._4_4_ = fVar84 * auVar62._4_4_;
        auVar61._0_4_ = fVar82 * auVar62._0_4_;
        auVar61._8_4_ = fVar85 * auVar62._8_4_;
        auVar61._12_4_ = fVar86 * auVar62._12_4_;
        auVar61._16_4_ = fVar87 * auVar62._16_4_;
        auVar61._20_4_ = fVar88 * auVar62._20_4_;
        auVar61._24_4_ = fVar89 * auVar62._24_4_;
        auVar61._28_4_ = auVar62._28_4_;
        auVar60 = vminps_avx(auVar60,auVar61);
        auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])(sVar33 + 0x40 + (uVar34 ^ 0x20)),
                                  auVar102._0_32_);
        auVar62._4_4_ = fVar91 * auVar61._4_4_;
        auVar62._0_4_ = fVar90 * auVar61._0_4_;
        auVar62._8_4_ = fVar92 * auVar61._8_4_;
        auVar62._12_4_ = fVar93 * auVar61._12_4_;
        auVar62._16_4_ = fVar94 * auVar61._16_4_;
        auVar62._20_4_ = fVar95 * auVar61._20_4_;
        auVar62._24_4_ = fVar96 * auVar61._24_4_;
        auVar62._28_4_ = auVar61._28_4_;
        auVar61 = vminps_avx(auVar62,auVar68._0_32_);
        auVar60 = vminps_avx(auVar60,auVar61);
        uVar35 = vcmpps_avx512vl(auVar59,auVar60,2);
        bVar25 = (byte)uVar35;
        if (bVar25 == 0) goto LAB_0078a5bb;
        auVar60 = *(undefined1 (*) [32])(sVar33 & 0xfffffffffffffff0);
        auVar61 = ((undefined1 (*) [32])(sVar33 & 0xfffffffffffffff0))[1];
        auVar62 = vpternlogd_avx512vl(auVar98._0_32_,auVar59,auVar99._0_32_,0xf8);
        auVar63 = vpcompressd_avx512vl(auVar62);
        auVar64._0_4_ =
             (uint)(bVar25 & 1) * auVar63._0_4_ | (uint)!(bool)(bVar25 & 1) * auVar62._0_4_;
        bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar13 * auVar63._4_4_ | (uint)!bVar13 * auVar62._4_4_;
        bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar13 * auVar63._8_4_ | (uint)!bVar13 * auVar62._8_4_;
        bVar13 = (bool)((byte)(uVar35 >> 3) & 1);
        auVar64._12_4_ = (uint)bVar13 * auVar63._12_4_ | (uint)!bVar13 * auVar62._12_4_;
        bVar13 = (bool)((byte)(uVar35 >> 4) & 1);
        auVar64._16_4_ = (uint)bVar13 * auVar63._16_4_ | (uint)!bVar13 * auVar62._16_4_;
        bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
        auVar64._20_4_ = (uint)bVar13 * auVar63._20_4_ | (uint)!bVar13 * auVar62._20_4_;
        bVar13 = (bool)((byte)(uVar35 >> 6) & 1);
        auVar64._24_4_ = (uint)bVar13 * auVar63._24_4_ | (uint)!bVar13 * auVar62._24_4_;
        bVar13 = SUB81(uVar35 >> 7,0);
        auVar64._28_4_ = (uint)bVar13 * auVar63._28_4_ | (uint)!bVar13 * auVar62._28_4_;
        auVar62 = vpermt2q_avx512vl(auVar60,auVar64,auVar61);
        sVar33 = auVar62._0_8_;
        bVar25 = bVar25 - 1 & bVar25;
        if (bVar25 != 0) {
          auVar62 = vpshufd_avx2(auVar64,0x55);
          vpermt2q_avx512vl(auVar60,auVar62,auVar61);
          auVar63 = vpminsd_avx2(auVar64,auVar62);
          auVar62 = vpmaxsd_avx2(auVar64,auVar62);
          bVar25 = bVar25 - 1 & bVar25;
          if (bVar25 == 0) {
            auVar64 = vpermi2q_avx512vl(auVar63,auVar60,auVar61);
            sVar33 = auVar64._0_8_;
            auVar60 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
            (local_2688->ptr).ptr = auVar60._0_8_;
            auVar59 = vpermd_avx2(auVar62,auVar59);
            local_2688->dist = auVar59._0_4_;
            local_2688 = local_2688 + 1;
          }
          else {
            auVar15 = vpshufd_avx2(auVar64,0xaa);
            vpermt2q_avx512vl(auVar60,auVar15,auVar61);
            auVar70 = vpminsd_avx2(auVar63,auVar15);
            auVar63 = vpmaxsd_avx2(auVar63,auVar15);
            auVar15 = vpminsd_avx2(auVar62,auVar63);
            auVar62 = vpmaxsd_avx2(auVar62,auVar63);
            bVar25 = bVar25 - 1 & bVar25;
            if (bVar25 == 0) {
              auVar64 = vpermi2q_avx512vl(auVar70,auVar60,auVar61);
              sVar33 = auVar64._0_8_;
              auVar64 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
              (local_2688->ptr).ptr = auVar64._0_8_;
              auVar62 = vpermd_avx2(auVar62,auVar59);
              local_2688->dist = auVar62._0_4_;
              auVar60 = vpermt2q_avx512vl(auVar60,auVar15,auVar61);
              local_2688[1].ptr.ptr = auVar60._0_8_;
              auVar59 = vpermd_avx2(auVar15,auVar59);
              local_2688[1].dist = auVar59._0_4_;
              local_2688 = local_2688 + 2;
            }
            else {
              auVar63 = vpshufd_avx2(auVar64,0xff);
              vpermt2q_avx512vl(auVar60,auVar63,auVar61);
              auVar14 = vpminsd_avx2(auVar70,auVar63);
              auVar63 = vpmaxsd_avx2(auVar70,auVar63);
              auVar70 = vpminsd_avx2(auVar15,auVar63);
              auVar63 = vpmaxsd_avx2(auVar15,auVar63);
              auVar15 = vpminsd_avx2(auVar62,auVar63);
              auVar62 = vpmaxsd_avx2(auVar62,auVar63);
              bVar25 = bVar25 - 1 & bVar25;
              if (bVar25 == 0) {
                auVar64 = vpermi2q_avx512vl(auVar14,auVar60,auVar61);
                sVar33 = auVar64._0_8_;
                auVar64 = vpermt2q_avx512vl(auVar60,auVar62,auVar61);
                (local_2688->ptr).ptr = auVar64._0_8_;
                auVar62 = vpermd_avx2(auVar62,auVar59);
                local_2688->dist = auVar62._0_4_;
                auVar62 = vpermt2q_avx512vl(auVar60,auVar15,auVar61);
                local_2688[1].ptr.ptr = auVar62._0_8_;
                auVar62 = vpermd_avx2(auVar15,auVar59);
                local_2688[1].dist = auVar62._0_4_;
                auVar60 = vpermt2q_avx512vl(auVar60,auVar70,auVar61);
                local_2688[2].ptr.ptr = auVar60._0_8_;
                auVar59 = vpermd_avx2(auVar70,auVar59);
                local_2688[2].dist = auVar59._0_4_;
                local_2688 = local_2688 + 3;
              }
              else {
                auVar65 = valignd_avx512vl(auVar64,auVar64,3);
                auVar64 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar63 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar64,auVar14);
                auVar64 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar63 = vpermt2d_avx512vl(auVar63,auVar64,auVar70);
                auVar63 = vpermt2d_avx512vl(auVar63,auVar64,auVar15);
                auVar64 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar62 = vpermt2d_avx512vl(auVar63,auVar64,auVar62);
                auVar100 = ZEXT3264(auVar62);
                bVar27 = bVar25;
                do {
                  auVar64 = auVar100._0_32_;
                  auVar70._8_4_ = 1;
                  auVar70._0_8_ = 0x100000001;
                  auVar70._12_4_ = 1;
                  auVar70._16_4_ = 1;
                  auVar70._20_4_ = 1;
                  auVar70._24_4_ = 1;
                  auVar70._28_4_ = 1;
                  auVar62 = vpermd_avx2(auVar70,auVar65);
                  auVar65 = valignd_avx512vl(auVar65,auVar65,1);
                  vpermt2q_avx512vl(auVar60,auVar65,auVar61);
                  bVar27 = bVar27 - 1 & bVar27;
                  uVar19 = vpcmpd_avx512vl(auVar62,auVar64,5);
                  auVar62 = vpmaxsd_avx2(auVar62,auVar64);
                  bVar20 = (byte)uVar19 << 1;
                  auVar64 = valignd_avx512vl(auVar64,auVar64,7);
                  bVar13 = (bool)((byte)uVar19 & 1);
                  auVar63._4_4_ = (uint)bVar13 * auVar64._4_4_ | (uint)!bVar13 * auVar62._4_4_;
                  auVar63._0_4_ = auVar62._0_4_;
                  bVar13 = (bool)(bVar20 >> 2 & 1);
                  auVar63._8_4_ = (uint)bVar13 * auVar64._8_4_ | (uint)!bVar13 * auVar62._8_4_;
                  bVar13 = (bool)(bVar20 >> 3 & 1);
                  auVar63._12_4_ = (uint)bVar13 * auVar64._12_4_ | (uint)!bVar13 * auVar62._12_4_;
                  bVar13 = (bool)(bVar20 >> 4 & 1);
                  auVar63._16_4_ = (uint)bVar13 * auVar64._16_4_ | (uint)!bVar13 * auVar62._16_4_;
                  bVar13 = (bool)(bVar20 >> 5 & 1);
                  auVar63._20_4_ = (uint)bVar13 * auVar64._20_4_ | (uint)!bVar13 * auVar62._20_4_;
                  bVar13 = (bool)(bVar20 >> 6 & 1);
                  auVar63._24_4_ = (uint)bVar13 * auVar64._24_4_ | (uint)!bVar13 * auVar62._24_4_;
                  auVar63._28_4_ =
                       (uint)(bVar20 >> 7) * auVar64._28_4_ |
                       (uint)!(bool)(bVar20 >> 7) * auVar62._28_4_;
                  auVar100 = ZEXT3264(auVar63);
                } while (bVar27 != 0);
                lVar26 = (ulong)(uint)POPCOUNT((uint)bVar25) + 3;
                do {
                  auVar62 = vpermi2q_avx512vl(auVar63,auVar60,auVar61);
                  (local_2688->ptr).ptr = auVar62._0_8_;
                  auVar64 = auVar100._0_32_;
                  auVar62 = vpermd_avx2(auVar64,auVar59);
                  local_2688->dist = auVar62._0_4_;
                  auVar63 = valignd_avx512vl(auVar64,auVar64,1);
                  local_2688 = local_2688 + 1;
                  auVar100 = ZEXT3264(auVar63);
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
                auVar59 = vpermt2q_avx512vl(auVar60,auVar63,auVar61);
                sVar33 = auVar59._0_8_;
              }
              auVar100 = ZEXT3264(local_2568);
              auVar101 = ZEXT3264(local_2588);
              auVar102 = ZEXT3264(local_25a8);
              auVar103 = ZEXT3264(local_25c8);
              auVar104 = ZEXT3264(local_25e8);
              auVar105 = ZEXT3264(local_2608);
              auVar97 = ZEXT3264(auVar97._0_32_);
              auVar98 = ZEXT3264(auVar98._0_32_);
              auVar99 = ZEXT3264(auVar99._0_32_);
            }
          }
        }
      }
      local_2680 = (ulong)((uint)sVar33 & 0xf) - 8;
      if (local_2680 != 0) {
        uVar29 = sVar33 & 0xfffffffffffffff0;
        local_2678 = 0;
        do {
          lVar26 = local_2678 * 0x50;
          local_2670 = context->scene;
          ppfVar4 = (local_2670->vertices).items;
          pfVar5 = ppfVar4[*(uint *)(uVar29 + 0x30 + lVar26)];
          pfVar6 = ppfVar4[*(uint *)(uVar29 + 0x34 + lVar26)];
          pfVar7 = ppfVar4[*(uint *)(uVar29 + 0x38 + lVar26)];
          pfVar8 = ppfVar4[*(uint *)(uVar29 + 0x3c + lVar26)];
          auVar55 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + lVar26)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar29 + 8 + lVar26)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + lVar26)),
                                  *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar29 + 8 + lVar26)));
          auVar52 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 4 + lVar26)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar29 + 0xc + lVar26)))
          ;
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 4 + lVar26)),
                                  *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar29 + 0xc + lVar26)))
          ;
          auVar53 = vunpcklps_avx(auVar56,auVar57);
          auVar54 = vunpcklps_avx(auVar55,auVar52);
          auVar57 = vunpckhps_avx(auVar55,auVar52);
          auVar52 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + 0x10 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar29 + 0x18 + lVar26)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + 0x10 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar29 + 0x18 + lVar26)));
          auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 0x14 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar29 + 0x1c + lVar26)));
          auVar55 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 0x14 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar29 + 0x1c + lVar26)));
          auVar39 = vunpcklps_avx(auVar56,auVar55);
          auVar37 = vunpcklps_avx(auVar52,auVar36);
          auVar52 = vunpckhps_avx(auVar52,auVar36);
          auVar36 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + 0x20 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar29 + 0x28 + lVar26)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar29 + 0x20 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar29 + 0x28 + lVar26)));
          auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 0x24 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar29 + 0x2c + lVar26)));
          auVar55 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar29 + 0x24 + lVar26))
                                  ,*(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar29 + 0x2c + lVar26)));
          auVar42 = vunpcklps_avx(auVar56,auVar55);
          auVar40 = vunpcklps_avx(auVar36,auVar38);
          puVar1 = (undefined8 *)(uVar29 + 0x30 + lVar26);
          local_2498 = *puVar1;
          uStack_2490 = puVar1[1];
          puVar1 = (undefined8 *)(uVar29 + 0x40 + lVar26);
          local_2618 = *puVar1;
          uStack_2610 = puVar1[1];
          uVar74 = *(undefined4 *)(ray + k * 4);
          auVar41._4_4_ = uVar74;
          auVar41._0_4_ = uVar74;
          auVar41._8_4_ = uVar74;
          auVar41._12_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar43._4_4_ = uVar74;
          auVar43._0_4_ = uVar74;
          auVar43._8_4_ = uVar74;
          auVar43._12_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar44._4_4_ = uVar74;
          auVar44._0_4_ = uVar74;
          auVar44._8_4_ = uVar74;
          auVar44._12_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar71._4_4_ = uVar74;
          auVar71._0_4_ = uVar74;
          auVar71._8_4_ = uVar74;
          auVar71._12_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar73._4_4_ = uVar74;
          auVar73._0_4_ = uVar74;
          auVar73._8_4_ = uVar74;
          auVar73._12_4_ = uVar74;
          auVar36 = vunpckhps_avx512vl(auVar36,auVar38);
          fVar75 = *(float *)(ray + k * 4 + 0x60);
          auVar83._4_4_ = fVar75;
          auVar83._0_4_ = fVar75;
          auVar83._8_4_ = fVar75;
          auVar83._12_4_ = fVar75;
          auVar56 = vsubps_avx(auVar54,auVar41);
          auVar57 = vsubps_avx(auVar57,auVar43);
          auVar55 = vsubps_avx(auVar53,auVar44);
          auVar37 = vsubps_avx512vl(auVar37,auVar41);
          auVar38 = vsubps_avx512vl(auVar52,auVar43);
          auVar39 = vsubps_avx512vl(auVar39,auVar44);
          auVar40 = vsubps_avx512vl(auVar40,auVar41);
          auVar41 = vsubps_avx512vl(auVar36,auVar43);
          auVar52 = vsubps_avx(auVar42,auVar44);
          auVar42 = vsubps_avx512vl(auVar40,auVar56);
          auVar53 = vsubps_avx(auVar41,auVar57);
          auVar54 = vsubps_avx(auVar52,auVar55);
          auVar43 = vsubps_avx512vl(auVar56,auVar37);
          auVar44 = vsubps_avx512vl(auVar57,auVar38);
          auVar45 = vsubps_avx512vl(auVar55,auVar39);
          auVar46 = vsubps_avx512vl(auVar37,auVar40);
          auVar47 = vsubps_avx512vl(auVar38,auVar41);
          auVar48 = vsubps_avx512vl(auVar39,auVar52);
          auVar36 = vaddps_avx512vl(auVar40,auVar56);
          auVar72._0_4_ = auVar41._0_4_ + auVar57._0_4_;
          auVar72._4_4_ = auVar41._4_4_ + auVar57._4_4_;
          auVar72._8_4_ = auVar41._8_4_ + auVar57._8_4_;
          auVar72._12_4_ = auVar41._12_4_ + auVar57._12_4_;
          auVar49 = vaddps_avx512vl(auVar52,auVar55);
          auVar50 = vmulps_avx512vl(auVar72,auVar54);
          auVar50 = vfmsub231ps_avx512vl(auVar50,auVar53,auVar49);
          auVar49 = vmulps_avx512vl(auVar49,auVar42);
          auVar49 = vfmsub231ps_avx512vl(auVar49,auVar54,auVar36);
          auVar51._0_4_ = auVar53._0_4_ * auVar36._0_4_;
          auVar51._4_4_ = auVar53._4_4_ * auVar36._4_4_;
          auVar51._8_4_ = auVar53._8_4_ * auVar36._8_4_;
          auVar51._12_4_ = auVar53._12_4_ * auVar36._12_4_;
          auVar36 = vfmsub231ps_fma(auVar51,auVar42,auVar72);
          auVar69._0_4_ = fVar75 * auVar36._0_4_;
          auVar69._4_4_ = fVar75 * auVar36._4_4_;
          auVar69._8_4_ = fVar75 * auVar36._8_4_;
          auVar69._12_4_ = fVar75 * auVar36._12_4_;
          auVar36 = vfmadd231ps_avx512vl(auVar69,auVar73,auVar49);
          local_2548 = vfmadd231ps_avx512vl(auVar36,auVar71,auVar50);
          auVar36 = vaddps_avx512vl(auVar56,auVar37);
          auVar49 = vaddps_avx512vl(auVar57,auVar38);
          auVar50 = vaddps_avx512vl(auVar55,auVar39);
          auVar51 = vmulps_avx512vl(auVar49,auVar45);
          auVar51 = vfmsub231ps_avx512vl(auVar51,auVar44,auVar50);
          auVar50 = vmulps_avx512vl(auVar50,auVar43);
          auVar50 = vfmsub231ps_avx512vl(auVar50,auVar45,auVar36);
          auVar36 = vmulps_avx512vl(auVar36,auVar44);
          auVar36 = vfmsub231ps_avx512vl(auVar36,auVar43,auVar49);
          auVar49._0_4_ = fVar75 * auVar36._0_4_;
          auVar49._4_4_ = fVar75 * auVar36._4_4_;
          auVar49._8_4_ = fVar75 * auVar36._8_4_;
          auVar49._12_4_ = fVar75 * auVar36._12_4_;
          auVar36 = vfmadd231ps_avx512vl(auVar49,auVar73,auVar50);
          local_2538 = vfmadd231ps_avx512vl(auVar36,auVar71,auVar51);
          auVar36 = vaddps_avx512vl(auVar37,auVar40);
          auVar37 = vaddps_avx512vl(auVar38,auVar41);
          auVar52 = vaddps_avx512vl(auVar39,auVar52);
          auVar39 = vmulps_avx512vl(auVar37,auVar48);
          auVar39 = vfmsub231ps_avx512vl(auVar39,auVar47,auVar52);
          auVar38._0_4_ = auVar52._0_4_ * auVar46._0_4_;
          auVar38._4_4_ = auVar52._4_4_ * auVar46._4_4_;
          auVar38._8_4_ = auVar52._8_4_ * auVar46._8_4_;
          auVar38._12_4_ = auVar52._12_4_ * auVar46._12_4_;
          auVar52 = vfmsub231ps_avx512vl(auVar38,auVar48,auVar36);
          auVar36 = vmulps_avx512vl(auVar36,auVar47);
          auVar36 = vfmsub231ps_avx512vl(auVar36,auVar46,auVar37);
          auVar36 = vmulps_avx512vl(auVar36,auVar83);
          auVar52 = vfmadd231ps_avx512vl(auVar36,auVar73,auVar52);
          auVar39 = vfmadd231ps_avx512vl(auVar52,auVar71,auVar39);
          auVar37._0_4_ = local_2548._0_4_ + local_2538._0_4_;
          auVar37._4_4_ = local_2548._4_4_ + local_2538._4_4_;
          auVar37._8_4_ = local_2548._8_4_ + local_2538._8_4_;
          auVar37._12_4_ = local_2548._12_4_ + local_2538._12_4_;
          local_2528 = vaddps_avx512vl(auVar39,auVar37);
          auVar52._8_4_ = 0x7fffffff;
          auVar52._0_8_ = 0x7fffffff7fffffff;
          auVar52._12_4_ = 0x7fffffff;
          auVar52 = vandps_avx512vl(local_2528,auVar52);
          auVar36._8_4_ = 0x34000000;
          auVar36._0_8_ = 0x3400000034000000;
          auVar36._12_4_ = 0x34000000;
          auVar36 = vmulps_avx512vl(auVar52,auVar36);
          auVar37 = vminps_avx512vl(local_2548,local_2538);
          auVar37 = vminps_avx512vl(auVar37,auVar39);
          auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar38 = vxorps_avx512vl(auVar36,auVar38);
          uVar19 = vcmpps_avx512vl(auVar37,auVar38,5);
          auVar37 = vmaxps_avx512vl(local_2548,local_2538);
          auVar39 = vmaxps_avx512vl(auVar37,auVar39);
          uVar16 = vcmpps_avx512vl(auVar39,auVar36,2);
          bVar25 = ((byte)uVar19 | (byte)uVar16) & 0xf;
          if (bVar25 != 0) {
            auVar36 = vmulps_avx512vl(auVar44,auVar54);
            auVar39 = vmulps_avx512vl(auVar42,auVar45);
            auVar37 = vmulps_avx512vl(auVar43,auVar53);
            auVar38 = vmulps_avx512vl(auVar47,auVar45);
            auVar40 = vmulps_avx512vl(auVar43,auVar48);
            auVar41 = vmulps_avx512vl(auVar46,auVar44);
            auVar53 = vfmsub213ps_avx512vl(auVar53,auVar45,auVar36);
            auVar54 = vfmsub213ps_avx512vl(auVar54,auVar43,auVar39);
            auVar42 = vfmsub213ps_avx512vl(auVar42,auVar44,auVar37);
            auVar44 = vfmsub213ps_avx512vl(auVar48,auVar44,auVar38);
            auVar45 = vfmsub213ps_avx512vl(auVar46,auVar45,auVar40);
            auVar43 = vfmsub213ps_avx512vl(auVar47,auVar43,auVar41);
            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar36 = vandps_avx512vl(auVar36,auVar46);
            auVar38 = vandps_avx512vl(auVar38,auVar46);
            uVar35 = vcmpps_avx512vl(auVar36,auVar38,1);
            auVar36 = vandps_avx512vl(auVar39,auVar46);
            auVar39 = vandps_avx512vl(auVar40,auVar46);
            uVar17 = vcmpps_avx512vl(auVar36,auVar39,1);
            auVar36 = vandps_avx512vl(auVar37,auVar46);
            auVar39 = vandps_avx512vl(auVar41,auVar46);
            uVar18 = vcmpps_avx512vl(auVar36,auVar39,1);
            bVar13 = (bool)((byte)uVar35 & 1);
            local_24d8._0_4_ = (uint)bVar13 * auVar53._0_4_ | (uint)!bVar13 * auVar44._0_4_;
            bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
            local_24d8._4_4_ = (uint)bVar13 * auVar53._4_4_ | (uint)!bVar13 * auVar44._4_4_;
            bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
            local_24d8._8_4_ = (uint)bVar13 * auVar53._8_4_ | (uint)!bVar13 * auVar44._8_4_;
            bVar13 = (bool)((byte)(uVar35 >> 3) & 1);
            local_24d8._12_4_ = (uint)bVar13 * auVar53._12_4_ | (uint)!bVar13 * auVar44._12_4_;
            bVar13 = (bool)((byte)uVar17 & 1);
            local_24c8._0_4_ = (uint)bVar13 * auVar54._0_4_ | (uint)!bVar13 * auVar45._0_4_;
            bVar13 = (bool)((byte)(uVar17 >> 1) & 1);
            local_24c8._4_4_ = (uint)bVar13 * auVar54._4_4_ | (uint)!bVar13 * auVar45._4_4_;
            bVar13 = (bool)((byte)(uVar17 >> 2) & 1);
            local_24c8._8_4_ = (uint)bVar13 * auVar54._8_4_ | (uint)!bVar13 * auVar45._8_4_;
            bVar13 = (bool)((byte)(uVar17 >> 3) & 1);
            local_24c8._12_4_ = (uint)bVar13 * auVar54._12_4_ | (uint)!bVar13 * auVar45._12_4_;
            bVar13 = (bool)((byte)uVar18 & 1);
            local_24b8[0] = (float)((uint)bVar13 * auVar42._0_4_ | (uint)!bVar13 * auVar43._0_4_);
            bVar13 = (bool)((byte)(uVar18 >> 1) & 1);
            local_24b8[1] = (float)((uint)bVar13 * auVar42._4_4_ | (uint)!bVar13 * auVar43._4_4_);
            bVar13 = (bool)((byte)(uVar18 >> 2) & 1);
            local_24b8[2] = (float)((uint)bVar13 * auVar42._8_4_ | (uint)!bVar13 * auVar43._8_4_);
            bVar13 = (bool)((byte)(uVar18 >> 3) & 1);
            local_24b8[3] = (float)((uint)bVar13 * auVar42._12_4_ | (uint)!bVar13 * auVar43._12_4_);
            auVar39._0_4_ = fVar75 * local_24b8[0];
            auVar39._4_4_ = fVar75 * local_24b8[1];
            auVar39._8_4_ = fVar75 * local_24b8[2];
            auVar39._12_4_ = fVar75 * local_24b8[3];
            auVar53 = vfmadd213ps_fma(auVar73,local_24c8,auVar39);
            auVar53 = vfmadd213ps_fma(auVar71,local_24d8,auVar53);
            auVar54._0_4_ = auVar53._0_4_ + auVar53._0_4_;
            auVar54._4_4_ = auVar53._4_4_ + auVar53._4_4_;
            auVar54._8_4_ = auVar53._8_4_ + auVar53._8_4_;
            auVar54._12_4_ = auVar53._12_4_ + auVar53._12_4_;
            auVar53._0_4_ = auVar55._0_4_ * local_24b8[0];
            auVar53._4_4_ = auVar55._4_4_ * local_24b8[1];
            auVar53._8_4_ = auVar55._8_4_ * local_24b8[2];
            auVar53._12_4_ = auVar55._12_4_ * local_24b8[3];
            auVar57 = vfmadd213ps_fma(auVar57,local_24c8,auVar53);
            auVar57 = vfmadd213ps_fma(auVar56,local_24d8,auVar57);
            auVar55 = vrcp14ps_avx512vl(auVar54);
            auVar56._8_4_ = 0x3f800000;
            auVar56._0_8_ = 0x3f8000003f800000;
            auVar56._12_4_ = 0x3f800000;
            auVar56 = vfnmadd213ps_avx512vl(auVar55,auVar54,auVar56);
            auVar56 = vfmadd132ps_fma(auVar56,auVar55,auVar55);
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar55._4_4_ = uVar74;
            auVar55._0_4_ = uVar74;
            auVar55._8_4_ = uVar74;
            auVar55._12_4_ = uVar74;
            auVar97 = ZEXT1664(auVar55);
            local_24e8._0_4_ = auVar56._0_4_ * (auVar57._0_4_ + auVar57._0_4_);
            local_24e8._4_4_ = auVar56._4_4_ * (auVar57._4_4_ + auVar57._4_4_);
            local_24e8._8_4_ = auVar56._8_4_ * (auVar57._8_4_ + auVar57._8_4_);
            local_24e8._12_4_ = auVar56._12_4_ * (auVar57._12_4_ + auVar57._12_4_);
            auVar68 = ZEXT1664(local_24e8);
            uVar19 = vcmpps_avx512vl(local_24e8,auVar55,2);
            uVar74 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar57._4_4_ = uVar74;
            auVar57._0_4_ = uVar74;
            auVar57._8_4_ = uVar74;
            auVar57._12_4_ = uVar74;
            uVar16 = vcmpps_avx512vl(local_24e8,auVar57,0xd);
            bVar25 = (byte)uVar19 & (byte)uVar16 & bVar25;
            if (bVar25 != 0) {
              uVar19 = vcmpps_avx512vl(auVar54,_DAT_01f7aa10,4);
              bVar25 = bVar25 & (byte)uVar19;
              if (bVar25 != 0) {
                local_2518 = &mapUV;
                local_2510 = bVar25;
                auVar42._8_4_ = 0x219392ef;
                auVar42._0_8_ = 0x219392ef219392ef;
                auVar42._12_4_ = 0x219392ef;
                uVar35 = vcmpps_avx512vl(auVar52,auVar42,5);
                auVar57 = vrcp14ps_avx512vl(local_2528);
                auVar48._8_4_ = 0x3f800000;
                auVar48._0_8_ = 0x3f8000003f800000;
                auVar48._12_4_ = 0x3f800000;
                auVar56 = vfnmadd213ps_fma(local_2528,auVar57,auVar48);
                auVar56 = vfmadd132ps_avx512vl(auVar56,auVar57,auVar57);
                fVar75 = (float)((uint)((byte)uVar35 & 1) * auVar56._0_4_);
                fVar76 = (float)((uint)((byte)(uVar35 >> 1) & 1) * auVar56._4_4_);
                fVar90 = (float)((uint)((byte)(uVar35 >> 2) & 1) * auVar56._8_4_);
                fVar82 = (float)((uint)((byte)(uVar35 >> 3) & 1) * auVar56._12_4_);
                auVar45._0_4_ = fVar75 * local_2548._0_4_;
                auVar45._4_4_ = fVar76 * local_2548._4_4_;
                auVar45._8_4_ = fVar90 * local_2548._8_4_;
                auVar45._12_4_ = fVar82 * local_2548._12_4_;
                local_2508 = vminps_avx(auVar45,auVar48);
                auVar46._0_4_ = fVar75 * local_2538._0_4_;
                auVar46._4_4_ = fVar76 * local_2538._4_4_;
                auVar46._8_4_ = fVar90 * local_2538._8_4_;
                auVar46._12_4_ = fVar82 * local_2538._12_4_;
                local_24f8 = vminps_avx(auVar46,auVar48);
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar56 = vblendmps_avx512vl(auVar47,local_24e8);
                auVar40._0_4_ =
                     (uint)(bVar25 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
                bVar13 = (bool)(bVar25 >> 1 & 1);
                auVar40._4_4_ = (uint)bVar13 * auVar56._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)(bVar25 >> 2 & 1);
                auVar40._8_4_ = (uint)bVar13 * auVar56._8_4_ | (uint)!bVar13 * 0x7f800000;
                auVar40._12_4_ =
                     (uint)(bVar25 >> 3) * auVar56._12_4_ | (uint)!(bool)(bVar25 >> 3) * 0x7f800000;
                auVar56 = vshufps_avx(auVar40,auVar40,0xb1);
                auVar56 = vminps_avx(auVar56,auVar40);
                auVar57 = vshufpd_avx(auVar56,auVar56,1);
                auVar56 = vminps_avx(auVar57,auVar56);
                uVar19 = vcmpps_avx512vl(auVar40,auVar56,0);
                bVar27 = (byte)uVar19 & bVar25;
                do {
                  bVar20 = bVar25;
                  if (bVar27 != 0) {
                    bVar20 = bVar27;
                  }
                  uVar21 = 0;
                  for (uVar28 = (uint)bVar20; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x80000000)
                  {
                    uVar21 = uVar21 + 1;
                  }
                  uVar32 = uVar21 & 0xff;
                  uVar28 = *(uint *)((long)&local_2498 + (ulong)uVar32 * 4);
                  pGVar9 = (local_2670->geometries).items[uVar28].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar25 = ~(byte)(1 << (uVar21 & 0x1f)) & bVar25;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar35 = (ulong)(uVar32 << 2);
                      uVar74 = *(undefined4 *)(local_2508 + uVar35);
                      uVar3 = *(undefined4 *)(local_24f8 + uVar35);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24e8 + uVar35);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_24d8 + uVar35);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_24c8 + uVar35);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_24b8 + uVar35);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar74;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_2618 + uVar35);
                      *(uint *)(ray + k * 4 + 0x120) = uVar28;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar35 = (ulong)(uVar32 * 4);
                    uVar74 = *(undefined4 *)(local_2508 + uVar35);
                    local_2458._4_4_ = uVar74;
                    local_2458._0_4_ = uVar74;
                    local_2458._8_4_ = uVar74;
                    local_2458._12_4_ = uVar74;
                    local_2448 = *(undefined4 *)(local_24f8 + uVar35);
                    local_2428 = vpbroadcastd_avx512vl();
                    uVar74 = *(undefined4 *)((long)&local_2618 + uVar35);
                    local_2438._4_4_ = uVar74;
                    local_2438._0_4_ = uVar74;
                    local_2438._8_4_ = uVar74;
                    local_2438._12_4_ = uVar74;
                    uVar74 = *(undefined4 *)(local_24d8 + uVar35);
                    uVar3 = *(undefined4 *)(local_24c8 + uVar35);
                    local_2478._4_4_ = uVar3;
                    local_2478._0_4_ = uVar3;
                    local_2478._8_4_ = uVar3;
                    local_2478._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)((long)local_24b8 + uVar35);
                    local_2468._4_4_ = uVar3;
                    local_2468._0_4_ = uVar3;
                    local_2468._8_4_ = uVar3;
                    local_2468._12_4_ = uVar3;
                    local_2488[0] = (RTCHitN)(char)uVar74;
                    local_2488[1] = (RTCHitN)(char)((uint)uVar74 >> 8);
                    local_2488[2] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
                    local_2488[3] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
                    local_2488[4] = (RTCHitN)(char)uVar74;
                    local_2488[5] = (RTCHitN)(char)((uint)uVar74 >> 8);
                    local_2488[6] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
                    local_2488[7] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
                    local_2488[8] = (RTCHitN)(char)uVar74;
                    local_2488[9] = (RTCHitN)(char)((uint)uVar74 >> 8);
                    local_2488[10] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
                    local_2488[0xb] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
                    local_2488[0xc] = (RTCHitN)(char)uVar74;
                    local_2488[0xd] = (RTCHitN)(char)((uint)uVar74 >> 8);
                    local_2488[0xe] = (RTCHitN)(char)((uint)uVar74 >> 0x10);
                    local_2488[0xf] = (RTCHitN)(char)((uint)uVar74 >> 0x18);
                    uStack_2444 = local_2448;
                    uStack_2440 = local_2448;
                    uStack_243c = local_2448;
                    vpcmpeqd_avx2(ZEXT1632(local_2458),ZEXT1632(local_2458));
                    uStack_2414 = context->user->instID[0];
                    local_2418 = uStack_2414;
                    uStack_2410 = uStack_2414;
                    uStack_240c = uStack_2414;
                    uStack_2408 = context->user->instPrimID[0];
                    uStack_2404 = uStack_2408;
                    uStack_2400 = uStack_2408;
                    uStack_23fc = uStack_2408;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_24e8 + uVar35);
                    local_26a8 = local_24a8;
                    args.valid = (int *)local_26a8;
                    args.geometryUserPtr = pGVar9->userPtr;
                    args.context = context->user;
                    args.hit = local_2488;
                    args.N = 4;
                    auVar56 = auVar68._0_16_;
                    auVar57 = auVar97._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar9->intersectionFilterN)(&args);
                      auVar97 = ZEXT1664(auVar57);
                      auVar68 = ZEXT1664(auVar56);
                      auVar105 = ZEXT3264(local_2608);
                      auVar104 = ZEXT3264(local_25e8);
                      auVar103 = ZEXT3264(local_25c8);
                      auVar102 = ZEXT3264(local_25a8);
                      auVar101 = ZEXT3264(local_2588);
                      auVar100 = ZEXT3264(local_2568);
                    }
                    uVar35 = vptestmd_avx512vl(local_26a8,local_26a8);
                    if ((uVar35 & 0xf) == 0) {
LAB_0078a47e:
                      *(int *)(ray + k * 4 + 0x80) = auVar97._0_4_;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&args);
                        auVar97 = ZEXT1664(auVar57);
                        auVar68 = ZEXT1664(auVar56);
                        auVar105 = ZEXT3264(local_2608);
                        auVar104 = ZEXT3264(local_25e8);
                        auVar103 = ZEXT3264(local_25c8);
                        auVar102 = ZEXT3264(local_25a8);
                        auVar101 = ZEXT3264(local_2588);
                        auVar100 = ZEXT3264(local_2568);
                      }
                      uVar35 = vptestmd_avx512vl(local_26a8,local_26a8);
                      uVar35 = uVar35 & 0xf;
                      bVar27 = (byte)uVar35;
                      if (bVar27 == 0) goto LAB_0078a47e;
                      iVar2 = *(int *)(args.hit + 4);
                      iVar22 = *(int *)(args.hit + 8);
                      iVar23 = *(int *)(args.hit + 0xc);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar27 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xcc);
                      iVar2 = *(int *)(args.hit + 0x14);
                      iVar22 = *(int *)(args.hit + 0x18);
                      iVar23 = *(int *)(args.hit + 0x1c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xdc);
                      iVar2 = *(int *)(args.hit + 0x24);
                      iVar22 = *(int *)(args.hit + 0x28);
                      iVar23 = *(int *)(args.hit + 0x2c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xec);
                      iVar2 = *(int *)(args.hit + 0x34);
                      iVar22 = *(int *)(args.hit + 0x38);
                      iVar23 = *(int *)(args.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      bVar11 = (bool)((byte)(uVar35 >> 2) & 1);
                      bVar12 = SUB81(uVar35 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar11 * iVar22 | (uint)!bVar11 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar12 * iVar23 | (uint)!bVar12 * *(int *)(args.ray + 0xfc);
                      auVar56 = *(undefined1 (*) [16])(args.ray + 0x100);
                      auVar50._0_4_ =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * auVar56._0_4_;
                      bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                      auVar50._4_4_ =
                           (uint)bVar13 * *(int *)(args.hit + 0x44) | (uint)!bVar13 * auVar56._4_4_;
                      bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
                      auVar50._8_4_ =
                           (uint)bVar13 * *(int *)(args.hit + 0x48) | (uint)!bVar13 * auVar56._8_4_;
                      bVar13 = SUB81(uVar35 >> 3,0);
                      auVar50._12_4_ =
                           (uint)bVar13 * *(int *)(args.hit + 0x4c) | (uint)!bVar13 * auVar56._12_4_
                      ;
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar50;
                      auVar56 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar56;
                      auVar56 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar56;
                      auVar56 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar56;
                      auVar56 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar56;
                      auVar97 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar74 = auVar97._0_4_;
                    auVar67._4_4_ = uVar74;
                    auVar67._0_4_ = uVar74;
                    auVar67._8_4_ = uVar74;
                    auVar67._12_4_ = uVar74;
                    uVar19 = vcmpps_avx512vl(auVar68._0_16_,auVar67,2);
                    bVar25 = ~(byte)(1 << (uVar21 & 0x1f)) & bVar25 & (byte)uVar19;
                  }
                  if (bVar25 == 0) break;
                  auVar66._8_4_ = 0x7f800000;
                  auVar66._0_8_ = 0x7f8000007f800000;
                  auVar66._12_4_ = 0x7f800000;
                  auVar56 = vblendmps_avx512vl(auVar66,auVar68._0_16_);
                  auVar58._0_4_ =
                       (uint)(bVar25 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar25 & 1) * 0x7f800000;
                  bVar13 = (bool)(bVar25 >> 1 & 1);
                  auVar58._4_4_ = (uint)bVar13 * auVar56._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(bVar25 >> 2 & 1);
                  auVar58._8_4_ = (uint)bVar13 * auVar56._8_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar58._12_4_ =
                       (uint)(bVar25 >> 3) * auVar56._12_4_ |
                       (uint)!(bool)(bVar25 >> 3) * 0x7f800000;
                  auVar56 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar56 = vminps_avx(auVar56,auVar58);
                  auVar57 = vshufpd_avx(auVar56,auVar56,1);
                  auVar56 = vminps_avx(auVar57,auVar56);
                  uVar19 = vcmpps_avx512vl(auVar58,auVar56,0);
                  bVar27 = (byte)uVar19 & bVar25;
                } while( true );
              }
            }
          }
          local_2678 = local_2678 + 1;
        } while (local_2678 != local_2680);
      }
      uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar68 = ZEXT3264(CONCAT428(uVar74,CONCAT424(uVar74,CONCAT420(uVar74,CONCAT416(uVar74,
                                                  CONCAT412(uVar74,CONCAT48(uVar74,CONCAT44(uVar74,
                                                  uVar74))))))));
      auVar97 = ZEXT3264(local_23f8);
      auVar98 = ZEXT3264(_DAT_01fe9900);
      auVar99 = ZEXT3264(CONCAT428(0xfffffff8,
                                   CONCAT424(0xfffffff8,
                                             CONCAT420(0xfffffff8,
                                                       CONCAT416(0xfffffff8,
                                                                 CONCAT412(0xfffffff8,
                                                                           CONCAT48(0xfffffff8,
                                                                                                                                                                        
                                                  0xfffffff8fffffff8)))))));
      uVar29 = local_2690;
      fVar75 = local_2398;
      fVar76 = fStack_2394;
      fVar77 = fStack_2390;
      fVar78 = fStack_238c;
      fVar79 = fStack_2388;
      fVar80 = fStack_2384;
      fVar81 = fStack_2380;
      fVar82 = local_23b8;
      fVar84 = fStack_23b4;
      fVar85 = fStack_23b0;
      fVar86 = fStack_23ac;
      fVar87 = fStack_23a8;
      fVar88 = fStack_23a4;
      fVar89 = fStack_23a0;
      fVar90 = local_23d8;
      fVar91 = fStack_23d4;
      fVar92 = fStack_23d0;
      fVar93 = fStack_23cc;
      fVar94 = fStack_23c8;
      fVar95 = fStack_23c4;
      fVar96 = fStack_23c0;
    }
LAB_0078a5bb:
    if (local_2688 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }